

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryNodeAnim(AssbinImporter *this,IOStream *stream,aiNodeAnim *nd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  aiAnimBehaviour aVar5;
  DeadlyImportError *this_00;
  ulong uVar6;
  aiQuatKey *paVar7;
  ulong uVar8;
  aiVectorKey *paVar9;
  aiVectorKey *local_4e0;
  aiQuatKey *local_4b8;
  aiVectorKey *local_490;
  aiString local_45c;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  aiNodeAnim *local_20;
  aiNodeAnim *nd_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_20 = nd;
  nd_local = (aiNodeAnim *)stream;
  stream_local = (IOStream *)this;
  uVar4 = Read<unsigned_int>(stream);
  if (uVar4 == 0x1238) {
    Read<unsigned_int>((IOStream *)nd_local);
    Read<aiString>(&local_45c,(IOStream *)nd_local);
    aiString::operator=(&local_20->mNodeName,&local_45c);
    uVar4 = Read<unsigned_int>((IOStream *)nd_local);
    local_20->mNumPositionKeys = uVar4;
    uVar4 = Read<unsigned_int>((IOStream *)nd_local);
    local_20->mNumRotationKeys = uVar4;
    uVar4 = Read<unsigned_int>((IOStream *)nd_local);
    local_20->mNumScalingKeys = uVar4;
    aVar5 = Read<unsigned_int>((IOStream *)nd_local);
    local_20->mPreState = aVar5;
    aVar5 = Read<unsigned_int>((IOStream *)nd_local);
    local_20->mPostState = aVar5;
    if (local_20->mNumPositionKeys != 0) {
      if ((this->shortened & 1U) == 0) {
        uVar6 = CONCAT44(0,local_20->mNumPositionKeys);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar6;
        uVar8 = SUB168(auVar1 * ZEXT816(0x18),0);
        if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
          uVar8 = 0xffffffffffffffff;
        }
        paVar9 = (aiVectorKey *)operator_new__(uVar8);
        if (uVar6 != 0) {
          local_490 = paVar9;
          do {
            aiVectorKey::aiVectorKey(local_490);
            local_490 = local_490 + 1;
          } while (local_490 != paVar9 + uVar6);
        }
        local_20->mPositionKeys = paVar9;
        ReadArray<aiVectorKey>
                  ((IOStream *)nd_local,local_20->mPositionKeys,local_20->mNumPositionKeys);
      }
      else {
        ReadBounds<aiVectorKey>
                  ((IOStream *)nd_local,local_20->mPositionKeys,local_20->mNumPositionKeys);
      }
    }
    if (local_20->mNumRotationKeys != 0) {
      if ((this->shortened & 1U) == 0) {
        uVar6 = CONCAT44(0,local_20->mNumRotationKeys);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar6;
        uVar8 = SUB168(auVar2 * ZEXT816(0x18),0);
        if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
          uVar8 = 0xffffffffffffffff;
        }
        paVar7 = (aiQuatKey *)operator_new__(uVar8);
        if (uVar6 != 0) {
          local_4b8 = paVar7;
          do {
            aiQuatKey::aiQuatKey(local_4b8);
            local_4b8 = local_4b8 + 1;
          } while (local_4b8 != paVar7 + uVar6);
        }
        local_20->mRotationKeys = paVar7;
        ReadArray<aiQuatKey>
                  ((IOStream *)nd_local,local_20->mRotationKeys,local_20->mNumRotationKeys);
      }
      else {
        ReadBounds<aiQuatKey>
                  ((IOStream *)nd_local,local_20->mRotationKeys,local_20->mNumRotationKeys);
      }
    }
    if (local_20->mNumScalingKeys != 0) {
      if ((this->shortened & 1U) == 0) {
        uVar6 = CONCAT44(0,local_20->mNumScalingKeys);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar6;
        uVar8 = SUB168(auVar3 * ZEXT816(0x18),0);
        if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
          uVar8 = 0xffffffffffffffff;
        }
        paVar9 = (aiVectorKey *)operator_new__(uVar8);
        if (uVar6 != 0) {
          local_4e0 = paVar9;
          do {
            aiVectorKey::aiVectorKey(local_4e0);
            local_4e0 = local_4e0 + 1;
          } while (local_4e0 != paVar9 + uVar6);
        }
        local_20->mScalingKeys = paVar9;
        ReadArray<aiVectorKey>
                  ((IOStream *)nd_local,local_20->mScalingKeys,local_20->mNumScalingKeys);
      }
      else {
        ReadBounds<aiVectorKey>
                  ((IOStream *)nd_local,local_20->mScalingKeys,local_20->mNumScalingKeys);
      }
    }
    return;
  }
  local_55 = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Magic chunk identifiers are wrong!",&local_41);
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  local_55 = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AssbinImporter::ReadBinaryNodeAnim(IOStream * stream, aiNodeAnim* nd) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AINODEANIM)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    nd->mNodeName = Read<aiString>(stream);
    nd->mNumPositionKeys = Read<unsigned int>(stream);
    nd->mNumRotationKeys = Read<unsigned int>(stream);
    nd->mNumScalingKeys = Read<unsigned int>(stream);
    nd->mPreState = (aiAnimBehaviour)Read<unsigned int>(stream);
    nd->mPostState = (aiAnimBehaviour)Read<unsigned int>(stream);

    if (nd->mNumPositionKeys) {
        if (shortened) {
            ReadBounds(stream,nd->mPositionKeys,nd->mNumPositionKeys);

        } // else write as usual
        else {
            nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];
            ReadArray<aiVectorKey>(stream,nd->mPositionKeys,nd->mNumPositionKeys);
        }
    }
    if (nd->mNumRotationKeys) {
        if (shortened) {
            ReadBounds(stream,nd->mRotationKeys,nd->mNumRotationKeys);

        }  else {
            // else write as usual
            nd->mRotationKeys = new aiQuatKey[nd->mNumRotationKeys];
            ReadArray<aiQuatKey>(stream,nd->mRotationKeys,nd->mNumRotationKeys);
        }
    }
    if (nd->mNumScalingKeys) {
        if (shortened) {
            ReadBounds(stream,nd->mScalingKeys,nd->mNumScalingKeys);

        }  else {
            // else write as usual
            nd->mScalingKeys = new aiVectorKey[nd->mNumScalingKeys];
            ReadArray<aiVectorKey>(stream,nd->mScalingKeys,nd->mNumScalingKeys);
        }
    }
}